

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_ledger.cpp
# Opt level: O2

int CfdFreeTxSerializeForLedger(void *handle,void *serialize_handle)

{
  vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
  *this;
  CfdCapiLedgerMetaData *metadata_struct;
  allocator local_39;
  string local_38;
  
  cfd::Initialize();
  if ((serialize_handle != (void *)0x0) &&
     (this = *(vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
               **)((long)serialize_handle + 0x10),
     this != (vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
              *)0x0)) {
    std::
    vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>::
    ~vector(this);
    operator_delete(this);
    *(undefined8 *)((long)serialize_handle + 0x10) = 0;
  }
  std::__cxx11::string::string((string *)&local_38,"LedgerMetaData",&local_39);
  cfd::capi::FreeBuffer(serialize_handle,&local_38,0x18);
  std::__cxx11::string::~string((string *)&local_38);
  return 0;
}

Assistant:

int CfdFreeTxSerializeForLedger(void* handle, void* serialize_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (serialize_handle != nullptr) {
      CfdCapiLedgerMetaData* metadata_struct =
          static_cast<CfdCapiLedgerMetaData*>(serialize_handle);
      if (metadata_struct->metadata_stack != nullptr) {
        delete metadata_struct->metadata_stack;
        metadata_struct->metadata_stack = nullptr;
      }
    }
    FreeBuffer(
        serialize_handle, kPrefixLedgerMetaData,
        sizeof(CfdCapiLedgerMetaData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}